

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O0

void fillAes4Rx4<false>(void *state,size_t outputSize,void *buffer)

{
  undefined8 *puVar1;
  undefined8 *in_RDX;
  long in_RSI;
  long lVar2;
  longlong in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  rx_vec_i128 in;
  rx_vec_i128 in_00;
  rx_vec_i128 in_01;
  rx_vec_i128 in_02;
  rx_vec_i128 in_03;
  rx_vec_i128 in_04;
  rx_vec_i128 in_05;
  rx_vec_i128 in_06;
  rx_vec_i128 in_07;
  rx_vec_i128 in_08;
  rx_vec_i128 in_09;
  rx_vec_i128 in_10;
  rx_vec_i128 in_11;
  rx_vec_i128 in_12;
  rx_vec_i128 in_13;
  rx_vec_i128 key;
  rx_vec_i128 key_00;
  rx_vec_i128 key_01;
  rx_vec_i128 key_02;
  rx_vec_i128 key_03;
  rx_vec_i128 key_04;
  rx_vec_i128 key_05;
  rx_vec_i128 key_06;
  rx_vec_i128 key_07;
  rx_vec_i128 key_08;
  rx_vec_i128 key_09;
  rx_vec_i128 key_10;
  rx_vec_i128 key_11;
  rx_vec_i128 key_12;
  rx_vec_i128 key_13;
  rx_vec_i128 key_14;
  rx_vec_i128 alVar3;
  rx_vec_i128 key7;
  rx_vec_i128 key6;
  rx_vec_i128 key5;
  rx_vec_i128 key4;
  rx_vec_i128 key3;
  rx_vec_i128 key2;
  rx_vec_i128 key1;
  rx_vec_i128 key0;
  rx_vec_i128 state3;
  rx_vec_i128 state2;
  rx_vec_i128 state1;
  rx_vec_i128 state0;
  uint8_t *outputEnd;
  uint8_t *outptr;
  undefined8 *local_1b8;
  
  puVar1 = (undefined8 *)((long)in_RDX + in_RSI);
  lVar2 = in_RSI;
  for (local_1b8 = in_RDX; local_1b8 < puVar1; local_1b8 = local_1b8 + 8) {
    alVar3[1] = lVar2;
    alVar3[0] = in_RDI;
    key[1] = in_RSI;
    key[0] = (longlong)in_RDX;
    alVar3 = aesdec<false>(alVar3,key);
    key_00[0] = alVar3[1];
    in[1] = lVar2;
    in[0] = in_RDI;
    key_00[1] = in_RSI;
    alVar3 = aesenc<false>(in,key_00);
    key_01[0] = alVar3[1];
    in_00[1] = lVar2;
    in_00[0] = in_RDI;
    key_01[1] = in_RSI;
    alVar3 = aesdec<false>(in_00,key_01);
    key_02[0] = alVar3[1];
    in_01[1] = lVar2;
    in_01[0] = in_RDI;
    key_02[1] = in_RSI;
    alVar3 = aesenc<false>(in_01,key_02);
    key_03[0] = alVar3[1];
    in_02[1] = lVar2;
    in_02[0] = in_RDI;
    key_03[1] = in_RSI;
    alVar3 = aesdec<false>(in_02,key_03);
    key_04[0] = alVar3[1];
    in_03[1] = lVar2;
    in_03[0] = in_RDI;
    key_04[1] = in_RSI;
    alVar3 = aesenc<false>(in_03,key_04);
    key_05[0] = alVar3[1];
    in_04[1] = lVar2;
    in_04[0] = in_RDI;
    key_05[1] = in_RSI;
    alVar3 = aesdec<false>(in_04,key_05);
    key_06[0] = alVar3[1];
    in_05[1] = lVar2;
    in_05[0] = in_RDI;
    key_06[1] = in_RSI;
    alVar3 = aesenc<false>(in_05,key_06);
    key_07[0] = alVar3[1];
    in_06[1] = lVar2;
    in_06[0] = in_RDI;
    key_07[1] = in_RSI;
    alVar3 = aesdec<false>(in_06,key_07);
    key_08[0] = alVar3[1];
    in_07[1] = lVar2;
    in_07[0] = in_RDI;
    key_08[1] = in_RSI;
    alVar3 = aesenc<false>(in_07,key_08);
    key_09[0] = alVar3[1];
    in_08[1] = lVar2;
    in_08[0] = in_RDI;
    key_09[1] = in_RSI;
    alVar3 = aesdec<false>(in_08,key_09);
    key_10[0] = alVar3[1];
    in_09[1] = lVar2;
    in_09[0] = in_RDI;
    key_10[1] = in_RSI;
    alVar3 = aesenc<false>(in_09,key_10);
    key_11[0] = alVar3[1];
    in_10[1] = lVar2;
    in_10[0] = in_RDI;
    key_11[1] = in_RSI;
    alVar3 = aesdec<false>(in_10,key_11);
    key_12[0] = alVar3[1];
    in_11[1] = lVar2;
    in_11[0] = in_RDI;
    key_12[1] = in_RSI;
    alVar3 = aesenc<false>(in_11,key_12);
    key_13[0] = alVar3[1];
    in_12[1] = lVar2;
    in_12[0] = in_RDI;
    key_13[1] = in_RSI;
    alVar3 = aesdec<false>(in_12,key_13);
    key_14[0] = alVar3[1];
    in_13[1] = lVar2;
    in_13[0] = in_RDI;
    key_14[1] = in_RSI;
    alVar3 = aesenc<false>(in_13,key_14);
    in_RDX = alVar3[1];
    *local_1b8 = extraout_XMM0_Qa;
    local_1b8[1] = extraout_XMM0_Qb;
    local_1b8[2] = extraout_XMM0_Qa_00;
    local_1b8[3] = extraout_XMM0_Qb_00;
    local_1b8[4] = extraout_XMM0_Qa_01;
    local_1b8[5] = extraout_XMM0_Qb_01;
    local_1b8[6] = extraout_XMM0_Qa_02;
    local_1b8[7] = extraout_XMM0_Qb_02;
  }
  return;
}

Assistant:

void fillAes4Rx4(void *state, size_t outputSize, void *buffer) {
	assert(outputSize % 64 == 0);
	const uint8_t* outptr = (uint8_t*)buffer;
	const uint8_t* outputEnd = outptr + outputSize;

	rx_vec_i128 state0, state1, state2, state3;
	rx_vec_i128 key0, key1, key2, key3, key4, key5, key6, key7;

	key0 = rx_set_int_vec_i128(AES_GEN_4R_KEY0);
	key1 = rx_set_int_vec_i128(AES_GEN_4R_KEY1);
	key2 = rx_set_int_vec_i128(AES_GEN_4R_KEY2);
	key3 = rx_set_int_vec_i128(AES_GEN_4R_KEY3);
	key4 = rx_set_int_vec_i128(AES_GEN_4R_KEY4);
	key5 = rx_set_int_vec_i128(AES_GEN_4R_KEY5);
	key6 = rx_set_int_vec_i128(AES_GEN_4R_KEY6);
	key7 = rx_set_int_vec_i128(AES_GEN_4R_KEY7);

	state0 = rx_load_vec_i128((rx_vec_i128*)state + 0);
	state1 = rx_load_vec_i128((rx_vec_i128*)state + 1);
	state2 = rx_load_vec_i128((rx_vec_i128*)state + 2);
	state3 = rx_load_vec_i128((rx_vec_i128*)state + 3);

	while (outptr < outputEnd) {
		state0 = aesdec<softAes>(state0, key0);
		state1 = aesenc<softAes>(state1, key0);
		state2 = aesdec<softAes>(state2, key4);
		state3 = aesenc<softAes>(state3, key4);

		state0 = aesdec<softAes>(state0, key1);
		state1 = aesenc<softAes>(state1, key1);
		state2 = aesdec<softAes>(state2, key5);
		state3 = aesenc<softAes>(state3, key5);

		state0 = aesdec<softAes>(state0, key2);
		state1 = aesenc<softAes>(state1, key2);
		state2 = aesdec<softAes>(state2, key6);
		state3 = aesenc<softAes>(state3, key6);

		state0 = aesdec<softAes>(state0, key3);
		state1 = aesenc<softAes>(state1, key3);
		state2 = aesdec<softAes>(state2, key7);
		state3 = aesenc<softAes>(state3, key7);

		rx_store_vec_i128((rx_vec_i128*)outptr + 0, state0);
		rx_store_vec_i128((rx_vec_i128*)outptr + 1, state1);
		rx_store_vec_i128((rx_vec_i128*)outptr + 2, state2);
		rx_store_vec_i128((rx_vec_i128*)outptr + 3, state3);

		outptr += 64;
	}
}